

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O0

Color * __thiscall
RayTracer::m_calcLocalIllumination
          (Color *__return_storage_ptr__,RayTracer *this,Collision *coll,Material *material)

{
  double dVar1;
  bool bVar2;
  reference ppLVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  __type _Var5;
  Color local_188;
  Color local_170;
  Color local_158;
  Color local_140;
  Color local_128;
  Color local_110;
  Vector3 local_f8;
  Vector3 local_e0;
  undefined1 local_c8 [8];
  Vector3 l;
  double shade;
  __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_> local_a0;
  const_iterator light;
  Color local_80;
  Color local_68;
  undefined1 local_50 [8];
  Color color;
  Vector3 r;
  Material *material_local;
  Collision *coll_local;
  RayTracer *this_local;
  
  Vector3::reflect((Vector3 *)&color.b,&coll->ray_dir,&coll->n);
  (*coll->object->_vptr_Object[3])(&local_68,coll->object,&coll->p);
  operator*((Color *)local_50,&material->color,&local_68);
  Scene::getAmbientLightColor((Color *)&light,this->m_scene);
  operator*(&local_80,(Color *)local_50,(Color *)&light);
  Color::operator*(__return_storage_ptr__,&local_80,material->diff);
  local_a0._M_current = (Light **)Scene::lightsBegin(this->m_scene);
  while( true ) {
    shade = (double)Scene::lightsEnd(this->m_scene);
    bVar2 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                        *)&shade);
    if (!bVar2) break;
    ppLVar3 = __gnu_cxx::
              __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
              operator*(&local_a0);
    (*(*ppLVar3)->_vptr_Light[4])(*ppLVar3,this->m_scene,&coll->p);
    if (1e-06 <= extraout_XMM0_Qa) {
      l.z = extraout_XMM0_Qa;
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
                operator*(&local_a0);
      (*(*ppLVar3)->_vptr_Light[2])(&local_f8);
      operator-(&local_e0,&local_f8,&coll->p);
      Vector3::unitize((Vector3 *)local_c8,&local_e0);
      if (1e-06 < material->diff) {
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                  ::operator*(&local_a0);
        Light::getColor(&local_140,*ppLVar3);
        operator*(&local_128,(Color *)local_50,&local_140);
        dVar1 = material->diff;
        dVar4 = Vector3::dot((Vector3 *)local_c8,&coll->n);
        Color::operator*(&local_110,&local_128,dVar1 * dVar4 * l.z);
        Color::operator+=(__return_storage_ptr__,&local_110);
      }
      if (1e-06 < material->spec) {
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                  ::operator*(&local_a0);
        Light::getColor(&local_188,*ppLVar3);
        operator*(&local_170,(Color *)local_50,&local_188);
        dVar1 = material->spec;
        dVar4 = Vector3::dot((Vector3 *)local_c8,(Vector3 *)&color.b);
        _Var5 = std::pow<double,int>(dVar4,0x32);
        Color::operator*(&local_158,&local_170,dVar1 * _Var5);
        Color::operator+=(__return_storage_ptr__,&local_158);
      }
    }
    __gnu_cxx::__normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
    operator++(&local_a0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_calcLocalIllumination(const Collision& coll, const Material* material) const
{
    Vector3 r = coll.ray_dir.reflect(coll.n);
    Color color = material->color * coll.object->getTextureColor(coll.p);
    Color ret = color * m_scene->getAmbientLightColor() * material->diff; // 环境光
    for (auto light = m_scene->lightsBegin(); light != m_scene->lightsEnd(); light++)
    {
        double shade = (*light)->getShadowRatio(m_scene, coll.p);
        if (shade < Const::EPS) continue;

        Vector3 l = ((*light)->getSource() - coll.p).unitize();
        if (material->diff > Const::EPS) // 漫反射
            ret += color * (*light)->getColor() * (material->diff * l.dot(coll.n) * shade);
        if (material->spec > Const::EPS) // 镜面反射
            ret += color * (*light)->getColor() * (material->spec * pow(l.dot(r), SPEC_POWER));
    }
    return ret;
}